

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptObject.cpp
# Opt level: O0

char16 * Js::JavascriptObject::ConstructName
                   (PropertyRecord *propertyRecord,char16 *getOrSetStr,ScriptContext *scriptContext)

{
  code *pcVar1;
  bool bVar2;
  charcount_t cVar3;
  HRESULT HVar4;
  undefined4 *puVar5;
  Recycler *pRVar6;
  char16 *_Src;
  size_t sVar7;
  char16 *propertyName;
  TrackAllocData local_60;
  size_t local_38;
  size_t totalChars;
  size_t propertyLength;
  char16 *finalName;
  ScriptContext *scriptContext_local;
  char16 *getOrSetStr_local;
  PropertyRecord *propertyRecord_local;
  
  finalName = (char16 *)scriptContext;
  scriptContext_local = (ScriptContext *)getOrSetStr;
  getOrSetStr_local = (char16 *)propertyRecord;
  if (propertyRecord == (PropertyRecord *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptObject.cpp"
                                ,0x829,"(propertyRecord)","propertyRecord");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
  }
  if (finalName == (char16 *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptObject.cpp"
                                ,0x82a,"(scriptContext)","scriptContext");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
  }
  propertyLength = 0;
  cVar3 = PropertyRecord::GetLength((PropertyRecord *)getOrSetStr_local);
  totalChars = (size_t)cVar3;
  if ((totalChars != 0) && (HVar4 = SizeTAdd(totalChars,5,&local_38), HVar4 == 0)) {
    pRVar6 = ScriptContext::GetRecycler((ScriptContext *)finalName);
    Memory::TrackAllocData::CreateTrackAllocData
              (&local_60,(type_info *)&char16_t::typeinfo,0,local_38,
               "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptObject.cpp"
               ,0x832);
    pRVar6 = Memory::Recycler::TrackAllocInfo(pRVar6,&local_60);
    propertyLength =
         (size_t)Memory::AllocateArray<Memory::Recycler,char16_t,false>
                           ((Memory *)pRVar6,(Recycler *)Memory::Recycler::AllocLeafZero,0,local_38)
    ;
    if ((char16_t *)propertyLength == (char16_t *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar5 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptObject.cpp"
                                  ,0x833,"(finalName != nullptr)","finalName != nullptr");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar5 = 0;
    }
    _Src = PropertyRecord::GetBuffer((PropertyRecord *)getOrSetStr_local);
    if (_Src == (char16 *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar5 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptObject.cpp"
                                  ,0x835,"(propertyName != nullptr)","propertyName != nullptr");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar5 = 0;
    }
    wcscpy_s((WCHAR *)propertyLength,local_38,_Src);
    if (scriptContext_local == (ScriptContext *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar5 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptObject.cpp"
                                  ,0x838,"(getOrSetStr != nullptr)","getOrSetStr != nullptr");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar5 = 0;
    }
    sVar7 = PAL_wcslen((char16_t *)scriptContext_local);
    if (sVar7 != 4) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar5 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptObject.cpp"
                                  ,0x839,"(PAL_wcslen(getOrSetStr) == 4)","wcslen(getOrSetStr) == 4"
                                 );
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar5 = 0;
    }
    wcscpy_s((WCHAR *)(propertyLength + totalChars * 2),5,(WCHAR *)scriptContext_local);
  }
  return (char16 *)propertyLength;
}

Assistant:

char16 * JavascriptObject::ConstructName(const PropertyRecord * propertyRecord, const char16 * getOrSetStr, ScriptContext* scriptContext)
{
    Assert(propertyRecord);
    Assert(scriptContext);
    char16 * finalName = nullptr;
    size_t propertyLength = (size_t)propertyRecord->GetLength();
    if (propertyLength > 0)
    {
        size_t totalChars;
        if (SizeTAdd(propertyLength, ConstructNameGetSetLength, &totalChars) == S_OK)
        {
            finalName = RecyclerNewArrayLeafZ(scriptContext->GetRecycler(), char16, totalChars);
            Assert(finalName != nullptr);
            const char16* propertyName = propertyRecord->GetBuffer();
            Assert(propertyName != nullptr);
            wcscpy_s(finalName, totalChars, propertyName);

            Assert(getOrSetStr != nullptr);
            Assert(wcslen(getOrSetStr) == 4);

            wcscpy_s(finalName + propertyLength, ConstructNameGetSetLength, getOrSetStr);
        }
    }
    return finalName;
}